

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error addBinding(XML_Parser parser,PREFIX *prefix,ATTRIBUTE_ID *attId,XML_Char *uri,
                    BINDING **bindingsPtr)

{
  bool bVar1;
  XML_Char *pXVar2;
  XML_Char *local_80;
  bool local_59;
  XML_Char *temp;
  BINDING *pBStack_48;
  int len;
  BINDING *b;
  XML_Bool isXMLNS;
  XML_Bool isXML;
  XML_Bool mustBeXML;
  BINDING **bindingsPtr_local;
  XML_Char *uri_local;
  ATTRIBUTE_ID *attId_local;
  PREFIX *prefix_local;
  XML_Parser parser_local;
  
  b._7_1_ = false;
  local_59 = true;
  bVar1 = true;
  if ((*uri == '\0') && (prefix->name != (XML_Char *)0x0)) {
    parser_local._4_4_ = XML_ERROR_UNDECLARING_PREFIX;
  }
  else {
    if ((prefix->name != (XML_Char *)0x0) &&
       (((*prefix->name == 'x' && (prefix->name[1] == 'm')) && (prefix->name[2] == 'l')))) {
      if (((prefix->name[3] == 'n') && (prefix->name[4] == 's')) && (prefix->name[5] == '\0')) {
        return XML_ERROR_RESERVED_PREFIX_XMLNS;
      }
      b._7_1_ = prefix->name[3] == '\0';
    }
    for (temp._4_4_ = 0; uri[temp._4_4_] != '\0'; temp._4_4_ = temp._4_4_ + 1) {
      if ((local_59) &&
         ((0x24 < temp._4_4_ ||
          (uri[temp._4_4_] != "http://www.w3.org/XML/1998/namespace"[temp._4_4_])))) {
        local_59 = false;
      }
      if (((b._7_1_ == false) && (bVar1)) &&
         ((0x1d < temp._4_4_ || (uri[temp._4_4_] != "http://www.w3.org/2000/xmlns/"[temp._4_4_]))))
      {
        bVar1 = false;
      }
      if ((parser->m_ns != '\0') && (uri[temp._4_4_] == parser->m_namespaceSeparator)) {
        return XML_ERROR_SYNTAX;
      }
    }
    local_59 = local_59 && temp._4_4_ == 0x24;
    if (b._7_1_ == local_59) {
      if (bVar1 && temp._4_4_ == 0x1d) {
        parser_local._4_4_ = XML_ERROR_RESERVED_NAMESPACE_URI;
      }
      else {
        if (parser->m_namespaceSeparator != '\0') {
          temp._4_4_ = temp._4_4_ + 1;
        }
        if (parser->m_freeBindingList == (BINDING *)0x0) {
          pBStack_48 = (BINDING *)(*(parser->m_mem).malloc_fcn)(0x30);
          if (pBStack_48 == (BINDING *)0x0) {
            return XML_ERROR_NO_MEMORY;
          }
          if (0x7fffffe7 < temp._4_4_) {
            return XML_ERROR_NO_MEMORY;
          }
          pXVar2 = (XML_Char *)(*(parser->m_mem).malloc_fcn)((long)(temp._4_4_ + 0x18));
          pBStack_48->uri = pXVar2;
          if (pBStack_48->uri == (XML_Char *)0x0) {
            (*(parser->m_mem).free_fcn)(pBStack_48);
            return XML_ERROR_NO_MEMORY;
          }
          pBStack_48->uriAlloc = temp._4_4_ + 0x18;
        }
        else {
          pBStack_48 = parser->m_freeBindingList;
          if (pBStack_48->uriAlloc < temp._4_4_) {
            if (0x7fffffe7 < temp._4_4_) {
              return XML_ERROR_NO_MEMORY;
            }
            pXVar2 = (XML_Char *)
                     (*(parser->m_mem).realloc_fcn)(pBStack_48->uri,(long)(temp._4_4_ + 0x18));
            if (pXVar2 == (XML_Char *)0x0) {
              return XML_ERROR_NO_MEMORY;
            }
            pBStack_48->uri = pXVar2;
            pBStack_48->uriAlloc = temp._4_4_ + 0x18;
          }
          parser->m_freeBindingList = pBStack_48->nextTagBinding;
        }
        pBStack_48->uriLen = temp._4_4_;
        memcpy(pBStack_48->uri,uri,(long)temp._4_4_);
        if (parser->m_namespaceSeparator != '\0') {
          pBStack_48->uri[temp._4_4_ + -1] = parser->m_namespaceSeparator;
        }
        pBStack_48->prefix = prefix;
        pBStack_48->attId = attId;
        pBStack_48->prevPrefixBinding = prefix->binding;
        if ((*uri == '\0') && (prefix == &parser->m_dtd->defaultPrefix)) {
          prefix->binding = (BINDING *)0x0;
        }
        else {
          prefix->binding = pBStack_48;
        }
        pBStack_48->nextTagBinding = *bindingsPtr;
        *bindingsPtr = pBStack_48;
        if ((attId != (ATTRIBUTE_ID *)0x0) &&
           (parser->m_startNamespaceDeclHandler != (XML_StartNamespaceDeclHandler)0x0)) {
          local_80 = uri;
          if (prefix->binding == (BINDING *)0x0) {
            local_80 = (XML_Char *)0x0;
          }
          (*parser->m_startNamespaceDeclHandler)(parser->m_handlerArg,prefix->name,local_80);
        }
        parser_local._4_4_ = XML_ERROR_NONE;
      }
    }
    else {
      parser_local._4_4_ = XML_ERROR_RESERVED_NAMESPACE_URI;
      if (b._7_1_ != false) {
        parser_local._4_4_ = XML_ERROR_RESERVED_PREFIX_XML;
      }
    }
  }
  return parser_local._4_4_;
}

Assistant:

static enum XML_Error
addBinding(XML_Parser parser, PREFIX *prefix, const ATTRIBUTE_ID *attId,
           const XML_Char *uri, BINDING **bindingsPtr) {
  static const XML_Char xmlNamespace[]
      = {ASCII_h,      ASCII_t,     ASCII_t,     ASCII_p,      ASCII_COLON,
         ASCII_SLASH,  ASCII_SLASH, ASCII_w,     ASCII_w,      ASCII_w,
         ASCII_PERIOD, ASCII_w,     ASCII_3,     ASCII_PERIOD, ASCII_o,
         ASCII_r,      ASCII_g,     ASCII_SLASH, ASCII_X,      ASCII_M,
         ASCII_L,      ASCII_SLASH, ASCII_1,     ASCII_9,      ASCII_9,
         ASCII_8,      ASCII_SLASH, ASCII_n,     ASCII_a,      ASCII_m,
         ASCII_e,      ASCII_s,     ASCII_p,     ASCII_a,      ASCII_c,
         ASCII_e,      '\0'};
  static const int xmlLen = (int)sizeof(xmlNamespace) / sizeof(XML_Char) - 1;
  static const XML_Char xmlnsNamespace[]
      = {ASCII_h,     ASCII_t,      ASCII_t, ASCII_p, ASCII_COLON,  ASCII_SLASH,
         ASCII_SLASH, ASCII_w,      ASCII_w, ASCII_w, ASCII_PERIOD, ASCII_w,
         ASCII_3,     ASCII_PERIOD, ASCII_o, ASCII_r, ASCII_g,      ASCII_SLASH,
         ASCII_2,     ASCII_0,      ASCII_0, ASCII_0, ASCII_SLASH,  ASCII_x,
         ASCII_m,     ASCII_l,      ASCII_n, ASCII_s, ASCII_SLASH,  '\0'};
  static const int xmlnsLen
      = (int)sizeof(xmlnsNamespace) / sizeof(XML_Char) - 1;

  XML_Bool mustBeXML = XML_FALSE;
  XML_Bool isXML = XML_TRUE;
  XML_Bool isXMLNS = XML_TRUE;

  BINDING *b;
  int len;

  /* empty URI is only valid for default namespace per XML NS 1.0 (not 1.1) */
  if (*uri == XML_T('\0') && prefix->name)
    return XML_ERROR_UNDECLARING_PREFIX;

  if (prefix->name && prefix->name[0] == XML_T(ASCII_x)
      && prefix->name[1] == XML_T(ASCII_m)
      && prefix->name[2] == XML_T(ASCII_l)) {
    /* Not allowed to bind xmlns */
    if (prefix->name[3] == XML_T(ASCII_n) && prefix->name[4] == XML_T(ASCII_s)
        && prefix->name[5] == XML_T('\0'))
      return XML_ERROR_RESERVED_PREFIX_XMLNS;

    if (prefix->name[3] == XML_T('\0'))
      mustBeXML = XML_TRUE;
  }

  for (len = 0; uri[len]; len++) {
    if (isXML && (len > xmlLen || uri[len] != xmlNamespace[len]))
      isXML = XML_FALSE;

    if (! mustBeXML && isXMLNS
        && (len > xmlnsLen || uri[len] != xmlnsNamespace[len]))
      isXMLNS = XML_FALSE;

    // NOTE: While Expat does not validate namespace URIs against RFC 3986,
    //       we have to at least make sure that the XML processor on top of
    //       Expat (that is splitting tag names by namespace separator into
    //       2- or 3-tuples (uri-local or uri-local-prefix)) cannot be confused
    //       by an attacker putting additional namespace separator characters
    //       into namespace declarations.  That would be ambiguous and not to
    //       be expected.
    if (parser->m_ns && (uri[len] == parser->m_namespaceSeparator)) {
      return XML_ERROR_SYNTAX;
    }
  }
  isXML = isXML && len == xmlLen;
  isXMLNS = isXMLNS && len == xmlnsLen;

  if (mustBeXML != isXML)
    return mustBeXML ? XML_ERROR_RESERVED_PREFIX_XML
                     : XML_ERROR_RESERVED_NAMESPACE_URI;

  if (isXMLNS)
    return XML_ERROR_RESERVED_NAMESPACE_URI;

  if (parser->m_namespaceSeparator)
    len++;
  if (parser->m_freeBindingList) {
    b = parser->m_freeBindingList;
    if (len > b->uriAlloc) {
      /* Detect and prevent integer overflow */
      if (len > INT_MAX - EXPAND_SPARE) {
        return XML_ERROR_NO_MEMORY;
      }

      /* Detect and prevent integer overflow.
       * The preprocessor guard addresses the "always false" warning
       * from -Wtype-limits on platforms where
       * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
      if ((unsigned)(len + EXPAND_SPARE) > (size_t)(-1) / sizeof(XML_Char)) {
        return XML_ERROR_NO_MEMORY;
      }
#endif

      XML_Char *temp = (XML_Char *)REALLOC(
          parser, b->uri, sizeof(XML_Char) * (len + EXPAND_SPARE));
      if (temp == NULL)
        return XML_ERROR_NO_MEMORY;
      b->uri = temp;
      b->uriAlloc = len + EXPAND_SPARE;
    }
    parser->m_freeBindingList = b->nextTagBinding;
  } else {
    b = (BINDING *)MALLOC(parser, sizeof(BINDING));
    if (! b)
      return XML_ERROR_NO_MEMORY;

    /* Detect and prevent integer overflow */
    if (len > INT_MAX - EXPAND_SPARE) {
      return XML_ERROR_NO_MEMORY;
    }
    /* Detect and prevent integer overflow.
     * The preprocessor guard addresses the "always false" warning
     * from -Wtype-limits on platforms where
     * sizeof(unsigned int) < sizeof(size_t), e.g. on x86_64. */
#if UINT_MAX >= SIZE_MAX
    if ((unsigned)(len + EXPAND_SPARE) > (size_t)(-1) / sizeof(XML_Char)) {
      return XML_ERROR_NO_MEMORY;
    }
#endif

    b->uri
        = (XML_Char *)MALLOC(parser, sizeof(XML_Char) * (len + EXPAND_SPARE));
    if (! b->uri) {
      FREE(parser, b);
      return XML_ERROR_NO_MEMORY;
    }
    b->uriAlloc = len + EXPAND_SPARE;
  }
  b->uriLen = len;
  memcpy(b->uri, uri, len * sizeof(XML_Char));
  if (parser->m_namespaceSeparator)
    b->uri[len - 1] = parser->m_namespaceSeparator;
  b->prefix = prefix;
  b->attId = attId;
  b->prevPrefixBinding = prefix->binding;
  /* NULL binding when default namespace undeclared */
  if (*uri == XML_T('\0') && prefix == &parser->m_dtd->defaultPrefix)
    prefix->binding = NULL;
  else
    prefix->binding = b;
  b->nextTagBinding = *bindingsPtr;
  *bindingsPtr = b;
  /* if attId == NULL then we are not starting a namespace scope */
  if (attId && parser->m_startNamespaceDeclHandler)
    parser->m_startNamespaceDeclHandler(parser->m_handlerArg, prefix->name,
                                        prefix->binding ? uri : 0);
  return XML_ERROR_NONE;
}